

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

void __thiscall ot::commissioner::coap::Message::SetToken(Message *this,uint8_t aTokenLength)

{
  uint32_t uVar1;
  long lVar2;
  
  if (aTokenLength < 9) {
    *(byte *)&this->mHeader = *(byte *)&this->mHeader & 0xf | aTokenLength << 4;
    if (aTokenLength != '\0') {
      lVar2 = 0;
      do {
        uVar1 = random::non_crypto::GetUint32();
        (this->mHeader).mToken[lVar2] = (uint8_t)uVar1;
        lVar2 = lVar2 + 1;
      } while ((ushort)aTokenLength != (ushort)lVar2);
    }
    return;
  }
  abort();
}

Assistant:

void Message::SetToken(uint8_t aTokenLength)
{
    VerifyOrDie(aTokenLength <= sizeof(mHeader.mToken));

    mHeader.mTokenLength = aTokenLength;
    random::non_crypto::FillBuffer(mHeader.mToken, aTokenLength);
}